

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverAlternatingMaximization.h
# Opt level: O2

bool __thiscall
BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  bool bVar1;
  BGIPSolution *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  shared_ptr<PartialJPDPValuePair> jppv;
  Interface_ProblemToPolicyDiscretePure *local_30;
  
  if (this->_m_solved == false) {
    (*(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
      super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
      _vptr_BayesianGameIdenticalPayoffSolver[4])(this);
  }
  *value = 0.0;
  this_00 = &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
             super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
             _m_solution;
  bVar1 = BGIPSolution::IsEmptyJPPV(this_00);
  if (bVar1) {
    bVar1 = BGIPSolution::IsEmptyPJPDP(this_00);
    if (bVar1) goto LAB_00422c54;
    BGIPSolution::GetNextSolutionPJPDP((BGIPSolution *)&stack0xffffffffffffffd0);
    (*(local_30->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[3]
    )();
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    BGIPSolution::GetNextSolutionJPPV((BGIPSolution *)&stack0xffffffffffffffd0);
    (*(local_30->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[3]
    )();
    dVar2 = extraout_XMM0_Qa_00;
  }
  *value = dVar2;
  boost::detail::shared_count::~shared_count((shared_count *)&stack0xffffffffffffffd8);
LAB_00422c54:
  boost::shared_ptr<JointPolicyDiscretePure>::reset(jpol);
  *value = 0.0;
  return false;
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
        if(!_m_solved)
            Solve();

        // since BFS computes all solutions. we just need to get
        // the next one from the solution and return it

        bool foundSolution = false;
        value = 0;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            value = jppv->GetValue();
        }
        else if(!this->IsEmptyPJPDP())
        {
            //alright, if I understand it correctly, it tries to convert the policy returned
            //to a "JointPolicyPureVectorForClusteredBG"

            const boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            value = jppv->GetValue();
        }

        if(!foundSolution)
        {
//                std::cout << "value " << value << " " <<  this->_m_nrSolutionsReturned <<  " "
//                          << this->GetNrDesiredSolutions() << " " 
//                          << this->GetBGIPI()->GetNrJointPolicies() << std::endl;
            jpol.reset();
            value = 0;
        }

        return(foundSolution);
    }